

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

appender fmt::v9::detail::write_int_noinline<char,fmt::v9::appender,unsigned__int128>
                   (appender out,write_int_arg<unsigned___int128> arg,
                   basic_format_specs<char> *specs,locale_ref loc)

{
  presentation_type pVar1;
  ulong uVar2;
  ulong uVar3;
  undefined1 value [16];
  undefined1 n [16];
  undefined1 value_00 [16];
  uint uVar4;
  char *digits;
  appender aVar5;
  byte *pbVar6;
  char *pcVar7;
  size_t sVar8;
  long lVar9;
  uint uVar10;
  char *digits_1;
  ulong uVar11;
  char *pcVar12;
  char *pcVar13;
  buffer<char> *buf;
  detail *pdVar14;
  int num_digits;
  long lVar15;
  long lVar16;
  bool bVar17;
  bool bVar18;
  format_decimal_result<char_*> fVar19;
  undefined8 in_stack_ffffffffffffff28;
  back_insert_iterator<fmt::v9::detail::buffer<char>_> bVar20;
  write_int_data<char> local_c8;
  undefined1 local_b8 [40];
  ulong local_90;
  int local_88;
  bool local_84;
  
  pVar1 = specs->type;
  switch(pVar1) {
  case none:
  case dec:
    if (((specs->field_0xa & 1) != 0) &&
       (value._8_8_ = out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container,
       value._0_8_ = in_stack_ffffffffffffff28,
       bVar17 = write_int_localized<fmt::v9::appender,unsigned__int128,char>
                          ((detail *)&stack0xffffffffffffff30,(appender *)(detail *)arg.abs_value,
                           (unsigned___int128)value,arg.abs_value._8_4_,
                           (basic_format_specs<char> *)(ulong)arg.prefix,(locale_ref)specs), bVar17)
       ) {
      return (back_insert_iterator<fmt::v9::detail::buffer<char>_>)
             out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container;
    }
    n._8_8_ = out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container;
    n._0_8_ = in_stack_ffffffffffffff28;
    local_88 = count_digits_fallback<unsigned__int128>((detail *)arg.abs_value,(unsigned___int128)n)
    ;
    if (specs->precision != -1 || specs->width != 0) {
      write_int_data<char>::write_int_data(&local_c8,local_88,arg.prefix,specs);
      local_b8._0_4_ = arg.prefix;
      local_b8._8_8_ = local_c8.size;
      local_b8._16_8_ = local_c8.padding;
      local_90 = arg.abs_value._8_8_;
      local_b8._32_8_ = (detail *)arg.abs_value;
      aVar5 = write_padded<(fmt::v9::align::type)2,fmt::v9::appender,char,fmt::v9::detail::write_int<fmt::v9::appender,char,fmt::v9::detail::write_int<char,fmt::v9::appender,unsigned__int128>(fmt::v9::appender,fmt::v9::detail::write_int_arg<unsigned__int128>,fmt::v9::basic_format_specs<char>const&,fmt::v9::detail::locale_ref)::_lambda(fmt::v9::appender)_1_>(fmt::v9::appender,int,unsigned_int,fmt::v9::basic_format_specs<char>const&,fmt::v9::detail::write_int<char,fmt::v9::appender,unsigned__int128>(fmt::v9::appender,fmt::v9::detail::write_int_arg<unsigned__int128>,fmt::v9::basic_format_specs<char>const&,fmt::v9::detail::locale_ref)::_lambda(fmt::v9::appender)_1_)::_lambda(fmt::v9::appender)_1_&>
                        (out,specs,local_c8.size,local_c8.size,(anon_class_64_3_4ecd7a16 *)local_b8)
      ;
      return (appender)
             aVar5.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container.container;
    }
    if (local_88 < 0) {
      assert_fail("/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/build_O3/_deps/fmt-src/include/fmt/core.h"
                  ,0x199,"negative value");
    }
    bVar20 = out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container;
    if ((arg.prefix != 0) &&
       (uVar10 = arg.prefix & 0xffffff,
       ((undefined1  [32])arg & (undefined1  [32])0xffffff) != (undefined1  [32])0x0)) {
      do {
        sVar8 = ((buffer<char> *)
                out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container)->size_;
        uVar11 = sVar8 + 1;
        if (((buffer<char> *)
            out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container)->capacity_ <
            uVar11) {
          (**((buffer<char> *)
             out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container)->_vptr_buffer
          )(out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container);
          sVar8 = ((buffer<char> *)
                  out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container)->size_;
          uVar11 = sVar8 + 1;
        }
        ((buffer<char> *)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container)->
        size_ = uVar11;
        ((buffer<char> *)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container)->
        ptr_[sVar8] = (char)uVar10;
        bVar17 = 0xff < uVar10;
        uVar10 = uVar10 >> 8;
      } while (bVar17);
    }
    value_00._8_8_ = bVar20.container;
    value_00._0_8_ = in_stack_ffffffffffffff28;
    fVar19 = format_decimal<char,unsigned__int128>
                       ((detail *)local_b8,(char *)(detail *)arg.abs_value,
                        (unsigned___int128)value_00,arg.abs_value._8_4_);
    pcVar7 = fVar19.end;
    break;
  case oct:
    uVar11 = arg.abs_value._8_8_;
    pdVar14 = (detail *)arg.abs_value;
    lVar15 = 0;
    do {
      lVar16 = lVar15;
      uVar2 = uVar11 << 0x3d;
      lVar15 = lVar16 + 1;
      bVar17 = (detail *)0x7 < pdVar14;
      bVar18 = uVar11 != 0;
      uVar3 = -uVar11;
      uVar11 = uVar11 >> 3;
      pdVar14 = (detail *)(uVar2 | (ulong)pdVar14 >> 3);
    } while (bVar18 || uVar3 < bVar17);
    num_digits = (int)lVar15;
    if (((specs->field_0x9 & 0x80) != 0) &&
       (((detail *)arg.abs_value != (detail *)0x0 || arg.abs_value._8_8_ != 0) &&
        specs->precision <= num_digits)) {
      uVar10 = 0x3000;
      if (arg.prefix == 0) {
        uVar10 = 0x30;
      }
      arg.prefix = (uVar10 | arg.prefix) + 0x1000000;
    }
    if (specs->precision != -1 || specs->width != 0) {
      write_int_data<char>::write_int_data(&local_c8,num_digits,arg.prefix,specs);
      local_b8._8_8_ = local_c8.size;
      local_b8._16_8_ = local_c8.padding;
      local_90 = arg.abs_value._8_8_;
      local_b8._32_8_ = (detail *)arg.abs_value;
      local_b8._0_4_ = arg.prefix;
      local_88 = num_digits;
      aVar5 = write_padded<(fmt::v9::align::type)2,fmt::v9::appender,char,fmt::v9::detail::write_int<fmt::v9::appender,char,fmt::v9::detail::write_int<char,fmt::v9::appender,unsigned__int128>(fmt::v9::appender,fmt::v9::detail::write_int_arg<unsigned__int128>,fmt::v9::basic_format_specs<char>const&,fmt::v9::detail::locale_ref)::_lambda(fmt::v9::appender)_4_>(fmt::v9::appender,int,unsigned_int,fmt::v9::basic_format_specs<char>const&,fmt::v9::detail::write_int<char,fmt::v9::appender,unsigned__int128>(fmt::v9::appender,fmt::v9::detail::write_int_arg<unsigned__int128>,fmt::v9::basic_format_specs<char>const&,fmt::v9::detail::locale_ref)::_lambda(fmt::v9::appender)_4_)::_lambda(fmt::v9::appender)_1_&>
                        (out,specs,local_c8.size,local_c8.size,(anon_class_64_3_4ecd7a16 *)local_b8)
      ;
      return (appender)
             aVar5.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container.container;
    }
    if ((arg.prefix != 0) && (uVar10 = arg.prefix & 0xffffff, (arg.prefix & 0xffffff) != 0)) {
      do {
        lVar9 = *(long *)((long)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.
                                container + 0x10);
        uVar11 = lVar9 + 1;
        if (*(ulong *)((long)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.
                             container + 0x18) < uVar11) {
          (*(code *)**(undefined8 **)
                      out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container)
                    (out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container);
          lVar9 = *(long *)((long)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.
                                  container + 0x10);
          uVar11 = lVar9 + 1;
        }
        *(ulong *)((long)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container +
                  0x10) = uVar11;
        *(char *)(*(long *)((long)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.
                                  container + 8) + lVar9) = (char)uVar10;
        bVar17 = 0xff < uVar10;
        uVar10 = uVar10 >> 8;
      } while (bVar17);
    }
    lVar9 = *(long *)((long)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container
                     + 0x10);
    uVar11 = lVar9 + lVar15;
    if (uVar11 <= *(ulong *)((long)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.
                                   container + 0x18)) {
      *(ulong *)((long)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container +
                0x10) = uVar11;
      if (*(long *)((long)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container +
                   8) != 0) {
        pbVar6 = (byte *)(*(long *)((long)out.
                                          super_back_insert_iterator<fmt::v9::detail::buffer<char>_>
                                          .container + 8) + lVar9 + lVar15);
        do {
          pbVar6 = pbVar6 + -1;
          uVar11 = arg.abs_value._8_8_ << 0x3d;
          *pbVar6 = (byte)(detail *)arg.abs_value & 7 | 0x30;
          bVar17 = ((detail *)arg.abs_value < (detail *)0x8) <= arg.abs_value._8_8_;
          arg.abs_value._8_8_ = arg.abs_value._8_8_ >> 3;
          arg.abs_value._0_8_ = (detail *)(uVar11 | (ulong)(detail *)arg.abs_value >> 3);
        } while (bVar17);
        return (appender)
               out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container.container;
      }
    }
    pbVar6 = local_b8 + lVar16;
    pcVar7 = local_b8 + lVar16 + 1;
    do {
      *pbVar6 = (byte)(detail *)arg.abs_value & 7 | 0x30;
      uVar11 = arg.abs_value._8_8_ << 0x3d;
      pbVar6 = pbVar6 + -1;
      bVar17 = (detail *)0x7 < (detail *)arg.abs_value;
      bVar18 = arg.abs_value._8_8_ != 0;
      uVar2 = -arg.abs_value._8_8_;
      arg.abs_value._8_8_ = arg.abs_value._8_8_ >> 3;
      arg.abs_value._0_8_ = (detail *)(uVar11 | (ulong)(detail *)arg.abs_value >> 3);
    } while (bVar18 || uVar2 < bVar17);
    break;
  case hex_lower:
  case hex_upper:
    if ((specs->field_0x9 & 0x80) != 0) {
      uVar4 = (uint)(pVar1 != hex_upper) << 0xd | 0x5830;
      uVar10 = uVar4 << 8;
      if (arg.prefix == 0) {
        uVar10 = uVar4;
      }
      arg.prefix = (uVar10 | arg.prefix) + 0x2000000;
    }
    uVar11 = arg.abs_value._8_8_;
    pdVar14 = (detail *)arg.abs_value;
    lVar15 = 0;
    do {
      lVar16 = lVar15;
      uVar2 = uVar11 << 0x3c;
      lVar15 = lVar16 + 1;
      bVar17 = (detail *)0xf < pdVar14;
      bVar18 = uVar11 != 0;
      uVar3 = -uVar11;
      uVar11 = uVar11 >> 4;
      pdVar14 = (detail *)(uVar2 | (ulong)pdVar14 >> 4);
    } while (bVar18 || uVar3 < bVar17);
    if (specs->precision != -1 || specs->width != 0) {
      write_int_data<char>::write_int_data(&local_c8,(int)lVar15,arg.prefix,specs);
      local_b8._8_8_ = local_c8.size;
      local_b8._16_8_ = local_c8.padding;
      local_90 = arg.abs_value._8_8_;
      local_b8._32_8_ = (detail *)arg.abs_value;
      local_b8._0_4_ = arg.prefix;
      local_88 = (int)lVar15;
      local_84 = pVar1 == hex_upper;
      aVar5 = write_padded<(fmt::v9::align::type)2,fmt::v9::appender,char,fmt::v9::detail::write_int<fmt::v9::appender,char,fmt::v9::detail::write_int<char,fmt::v9::appender,unsigned__int128>(fmt::v9::appender,fmt::v9::detail::write_int_arg<unsigned__int128>,fmt::v9::basic_format_specs<char>const&,fmt::v9::detail::locale_ref)::_lambda(fmt::v9::appender)_2_>(fmt::v9::appender,int,unsigned_int,fmt::v9::basic_format_specs<char>const&,fmt::v9::detail::write_int<char,fmt::v9::appender,unsigned__int128>(fmt::v9::appender,fmt::v9::detail::write_int_arg<unsigned__int128>,fmt::v9::basic_format_specs<char>const&,fmt::v9::detail::locale_ref)::_lambda(fmt::v9::appender)_2_)::_lambda(fmt::v9::appender)_1_&>
                        (out,specs,local_c8.size,local_c8.size,(anon_class_64_3_4ecd7a16 *)local_b8)
      ;
      return (appender)
             aVar5.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container.container;
    }
    if ((arg.prefix != 0) && (uVar10 = arg.prefix & 0xffffff, (arg.prefix & 0xffffff) != 0)) {
      do {
        lVar9 = *(long *)((long)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.
                                container + 0x10);
        uVar11 = lVar9 + 1;
        if (*(ulong *)((long)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.
                             container + 0x18) < uVar11) {
          (*(code *)**(undefined8 **)
                      out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container)
                    (out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container);
          lVar9 = *(long *)((long)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.
                                  container + 0x10);
          uVar11 = lVar9 + 1;
        }
        *(ulong *)((long)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container +
                  0x10) = uVar11;
        *(char *)(*(long *)((long)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.
                                  container + 8) + lVar9) = (char)uVar10;
        bVar17 = 0xff < uVar10;
        uVar10 = uVar10 >> 8;
      } while (bVar17);
    }
    lVar9 = *(long *)((long)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container
                     + 0x10);
    uVar11 = lVar9 + lVar15;
    if (uVar11 <= *(ulong *)((long)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.
                                   container + 0x18)) {
      *(ulong *)((long)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container +
                0x10) = uVar11;
      if (*(long *)((long)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container +
                   8) != 0) {
        pcVar7 = "0123456789abcdef";
        if (pVar1 == hex_upper) {
          pcVar7 = "0123456789ABCDEF";
        }
        pcVar12 = (char *)(*(long *)((long)out.
                                           super_back_insert_iterator<fmt::v9::detail::buffer<char>_>
                                           .container + 8) + lVar9 + lVar15);
        do {
          pcVar12 = pcVar12 + -1;
          uVar11 = arg.abs_value._8_8_ << 0x3c;
          *pcVar12 = pcVar7[(uint)(detail *)arg.abs_value & 0xf];
          bVar17 = ((detail *)arg.abs_value < (detail *)0x10) <= arg.abs_value._8_8_;
          arg.abs_value._8_8_ = arg.abs_value._8_8_ >> 4;
          arg.abs_value._0_8_ = (detail *)(uVar11 | (ulong)(detail *)arg.abs_value >> 4);
        } while (bVar17);
        return (appender)
               out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container.container;
      }
    }
    pcVar12 = local_b8 + lVar16;
    pcVar7 = local_b8 + lVar16 + 1;
    pcVar13 = "0123456789abcdef";
    if (pVar1 == hex_upper) {
      pcVar13 = "0123456789ABCDEF";
    }
    do {
      *pcVar12 = pcVar13[(uint)(detail *)arg.abs_value & 0xf];
      uVar11 = arg.abs_value._8_8_ << 0x3c;
      pcVar12 = pcVar12 + -1;
      bVar17 = (detail *)0xf < (detail *)arg.abs_value;
      bVar18 = arg.abs_value._8_8_ != 0;
      uVar2 = -arg.abs_value._8_8_;
      arg.abs_value._8_8_ = arg.abs_value._8_8_ >> 4;
      arg.abs_value._0_8_ = (detail *)(uVar11 | (ulong)(detail *)arg.abs_value >> 4);
    } while (bVar18 || uVar2 < bVar17);
    break;
  case bin_lower:
  case bin_upper:
    if ((specs->field_0x9 & 0x80) != 0) {
      uVar4 = (uint)(pVar1 != bin_upper) << 0xd | 0x4230;
      uVar10 = uVar4 << 8;
      if (arg.prefix == 0) {
        uVar10 = uVar4;
      }
      arg.prefix = (uVar10 | arg.prefix) + 0x2000000;
    }
    uVar11 = arg.abs_value._8_8_;
    pdVar14 = (detail *)arg.abs_value;
    lVar15 = 0;
    do {
      lVar16 = lVar15;
      uVar2 = uVar11 << 0x3f;
      lVar15 = lVar16 + 1;
      bVar17 = (detail *)0x1 < pdVar14;
      bVar18 = uVar11 != 0;
      uVar3 = -uVar11;
      uVar11 = uVar11 >> 1;
      pdVar14 = (detail *)(uVar2 | (ulong)pdVar14 >> 1);
    } while (bVar18 || uVar3 < bVar17);
    if (specs->precision != -1 || specs->width != 0) {
      write_int_data<char>::write_int_data(&local_c8,(int)lVar15,arg.prefix,specs);
      local_b8._8_8_ = local_c8.size;
      local_b8._16_8_ = local_c8.padding;
      local_90 = arg.abs_value._8_8_;
      local_b8._32_8_ = (detail *)arg.abs_value;
      local_b8._0_4_ = arg.prefix;
      local_88 = (int)lVar15;
      aVar5 = write_padded<(fmt::v9::align::type)2,fmt::v9::appender,char,fmt::v9::detail::write_int<fmt::v9::appender,char,fmt::v9::detail::write_int<char,fmt::v9::appender,unsigned__int128>(fmt::v9::appender,fmt::v9::detail::write_int_arg<unsigned__int128>,fmt::v9::basic_format_specs<char>const&,fmt::v9::detail::locale_ref)::_lambda(fmt::v9::appender)_3_>(fmt::v9::appender,int,unsigned_int,fmt::v9::basic_format_specs<char>const&,fmt::v9::detail::write_int<char,fmt::v9::appender,unsigned__int128>(fmt::v9::appender,fmt::v9::detail::write_int_arg<unsigned__int128>,fmt::v9::basic_format_specs<char>const&,fmt::v9::detail::locale_ref)::_lambda(fmt::v9::appender)_3_)::_lambda(fmt::v9::appender)_1_&>
                        (out,specs,local_c8.size,local_c8.size,(anon_class_64_3_4ecd7a16 *)local_b8)
      ;
      return (appender)
             aVar5.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container.container;
    }
    if ((arg.prefix != 0) && (uVar10 = arg.prefix & 0xffffff, (arg.prefix & 0xffffff) != 0)) {
      do {
        lVar9 = *(long *)((long)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.
                                container + 0x10);
        uVar11 = lVar9 + 1;
        if (*(ulong *)((long)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.
                             container + 0x18) < uVar11) {
          (*(code *)**(undefined8 **)
                      out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container)
                    (out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container);
          lVar9 = *(long *)((long)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.
                                  container + 0x10);
          uVar11 = lVar9 + 1;
        }
        *(ulong *)((long)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container +
                  0x10) = uVar11;
        *(char *)(*(long *)((long)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.
                                  container + 8) + lVar9) = (char)uVar10;
        bVar17 = 0xff < uVar10;
        uVar10 = uVar10 >> 8;
      } while (bVar17);
    }
    lVar9 = *(long *)((long)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container
                     + 0x10);
    uVar11 = lVar9 + lVar15;
    if (uVar11 <= *(ulong *)((long)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.
                                   container + 0x18)) {
      *(ulong *)((long)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container +
                0x10) = uVar11;
      if (*(long *)((long)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container +
                   8) != 0) {
        pbVar6 = (byte *)(*(long *)((long)out.
                                          super_back_insert_iterator<fmt::v9::detail::buffer<char>_>
                                          .container + 8) + lVar9 + lVar15);
        do {
          pbVar6 = pbVar6 + -1;
          uVar11 = arg.abs_value._8_8_ << 0x3f;
          *pbVar6 = (byte)(detail *)arg.abs_value & 1 | 0x30;
          bVar17 = ((detail *)arg.abs_value < (detail *)0x2) <= arg.abs_value._8_8_;
          arg.abs_value._8_8_ = arg.abs_value._8_8_ >> 1;
          arg.abs_value._0_8_ = (detail *)(uVar11 | (ulong)(detail *)arg.abs_value >> 1);
        } while (bVar17);
        return (appender)
               out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container.container;
      }
    }
    pbVar6 = local_b8 + lVar16;
    pcVar7 = local_b8 + lVar16 + 1;
    do {
      *pbVar6 = (byte)(detail *)arg.abs_value & 1 | 0x30;
      uVar11 = arg.abs_value._8_8_ << 0x3f;
      pbVar6 = pbVar6 + -1;
      bVar17 = (detail *)0x1 < (detail *)arg.abs_value;
      bVar18 = arg.abs_value._8_8_ != 0;
      uVar2 = -arg.abs_value._8_8_;
      arg.abs_value._8_8_ = arg.abs_value._8_8_ >> 1;
      arg.abs_value._0_8_ = (detail *)(uVar11 | (ulong)(detail *)arg.abs_value >> 1);
    } while (bVar18 || uVar2 < bVar17);
    break;
  default:
    throw_format_error("invalid type specifier");
  case chr:
    local_b8._0_4_ = (uint)CONCAT21(local_b8._2_2_,(char)arg.abs_value) << 8;
    aVar5 = write_padded<(fmt::v9::align::type)1,fmt::v9::appender,char,fmt::v9::detail::write_char<char,fmt::v9::appender>(fmt::v9::appender,char,fmt::v9::basic_format_specs<char>const&)::_lambda(fmt::v9::appender)_1_&>
                      (out,specs,1,1,(anon_class_2_2_bf5026b7 *)local_b8);
    return (appender)
           aVar5.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container.container;
  }
  aVar5 = copy_str_noinline<char,char*,fmt::v9::appender>(local_b8,pcVar7,out);
  return (appender)
         aVar5.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container.container;
}

Assistant:

FMT_CONSTEXPR FMT_NOINLINE auto write_int_noinline(
    OutputIt out, write_int_arg<T> arg, const basic_format_specs<Char>& specs,
    locale_ref loc) -> OutputIt {
  return write_int(out, arg, specs, loc);
}